

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpec::Pattern::Pattern(Pattern *this,string *name)

{
  pointer pcVar1;
  
  this->_vptr_Pattern = (_func_int **)&PTR__Pattern_001e3030;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

TestSpec::Pattern::Pattern( std::string const& name )
    : m_name( name )
    {}